

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BayesianProbitRegressor::InternalSwap
          (BayesianProbitRegressor *this,BayesianProbitRegressor *other)

{
  uint32_t uVar1;
  intptr_t iVar2;
  void *pvVar3;
  BayesianProbitRegressor_Gaussian *pBVar4;
  long __tmp;
  
  iVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar2;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->features_).super_RepeatedPtrFieldBase,
             &(other->features_).super_RepeatedPtrFieldBase);
  pvVar3 = (other->regressioninputfeaturename_).tagged_ptr_.ptr_;
  (other->regressioninputfeaturename_).tagged_ptr_.ptr_ =
       (this->regressioninputfeaturename_).tagged_ptr_.ptr_;
  (this->regressioninputfeaturename_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (other->optimisminputfeaturename_).tagged_ptr_.ptr_;
  (other->optimisminputfeaturename_).tagged_ptr_.ptr_ =
       (this->optimisminputfeaturename_).tagged_ptr_.ptr_;
  (this->optimisminputfeaturename_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (other->samplingscaleinputfeaturename_).tagged_ptr_.ptr_;
  (other->samplingscaleinputfeaturename_).tagged_ptr_.ptr_ =
       (this->samplingscaleinputfeaturename_).tagged_ptr_.ptr_;
  (this->samplingscaleinputfeaturename_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (other->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_;
  (other->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_ =
       (this->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_;
  (this->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (other->meanoutputfeaturename_).tagged_ptr_.ptr_;
  (other->meanoutputfeaturename_).tagged_ptr_.ptr_ = (this->meanoutputfeaturename_).tagged_ptr_.ptr_
  ;
  (this->meanoutputfeaturename_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (other->varianceoutputfeaturename_).tagged_ptr_.ptr_;
  (other->varianceoutputfeaturename_).tagged_ptr_.ptr_ =
       (this->varianceoutputfeaturename_).tagged_ptr_.ptr_;
  (this->varianceoutputfeaturename_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (other->pessimisticprobabilityoutputfeaturename_).tagged_ptr_.ptr_;
  (other->pessimisticprobabilityoutputfeaturename_).tagged_ptr_.ptr_ =
       (this->pessimisticprobabilityoutputfeaturename_).tagged_ptr_.ptr_;
  (this->pessimisticprobabilityoutputfeaturename_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (other->sampledprobabilityoutputfeaturename_).tagged_ptr_.ptr_;
  (other->sampledprobabilityoutputfeaturename_).tagged_ptr_.ptr_ =
       (this->sampledprobabilityoutputfeaturename_).tagged_ptr_.ptr_;
  (this->sampledprobabilityoutputfeaturename_).tagged_ptr_.ptr_ = pvVar3;
  pBVar4 = this->bias_;
  this->bias_ = other->bias_;
  other->bias_ = pBVar4;
  uVar1 = this->numberoffeatures_;
  this->numberoffeatures_ = other->numberoffeatures_;
  other->numberoffeatures_ = uVar1;
  return;
}

Assistant:

void BayesianProbitRegressor::InternalSwap(BayesianProbitRegressor* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  features_.InternalSwap(&other->features_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &regressioninputfeaturename_, lhs_arena,
      &other->regressioninputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &optimisminputfeaturename_, lhs_arena,
      &other->optimisminputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &samplingscaleinputfeaturename_, lhs_arena,
      &other->samplingscaleinputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &samplingtruncationinputfeaturename_, lhs_arena,
      &other->samplingtruncationinputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &meanoutputfeaturename_, lhs_arena,
      &other->meanoutputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &varianceoutputfeaturename_, lhs_arena,
      &other->varianceoutputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &pessimisticprobabilityoutputfeaturename_, lhs_arena,
      &other->pessimisticprobabilityoutputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &sampledprobabilityoutputfeaturename_, lhs_arena,
      &other->sampledprobabilityoutputfeaturename_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(BayesianProbitRegressor, numberoffeatures_)
      + sizeof(BayesianProbitRegressor::numberoffeatures_)
      - PROTOBUF_FIELD_OFFSET(BayesianProbitRegressor, bias_)>(
          reinterpret_cast<char*>(&bias_),
          reinterpret_cast<char*>(&other->bias_));
}